

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::GetExtractInsertValueType
          (ValidationState_t *_,Instruction *inst,uint32_t *member_type)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  int32_t iVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  size_type sVar7;
  DiagnosticStream *pDVar8;
  DiagnosticStream local_f58;
  unsigned_long local_d80;
  uint32_t local_d74;
  DiagnosticStream local_d70;
  ulong local_b98;
  size_t num_struct_members;
  Instruction *local_9b8;
  Instruction *size;
  uint64_t array_size;
  uint32_t local_7cc;
  undefined1 local_7c8 [4];
  uint32_t num_cols;
  uint32_t local_5ec;
  Instruction *pIStack_5e8;
  uint32_t vector_size;
  Instruction *type_inst;
  undefined1 local_5d8 [4];
  uint32_t component_index;
  char *local_400;
  DiagnosticStream local_3f8;
  char *local_220;
  DiagnosticStream local_218;
  uint local_40;
  uint local_3c;
  uint32_t kCompositeExtractInsertMaxNumIndices;
  uint32_t num_indices;
  uint32_t composite_id_index;
  uint32_t num_words;
  uint32_t word_index;
  Op opcode;
  uint32_t *member_type_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _word_index = member_type;
  member_type_local = (uint32_t *)inst;
  inst_local = (Instruction *)_;
  num_words = Instruction::opcode(inst);
  if (num_words != OpCompositeExtract && num_words != OpCompositeInsert) {
    __assert_fail("opcode == spv::Op::OpCompositeExtract || opcode == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                  ,0x26,
                  "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                 );
  }
  composite_id_index = 5;
  if (num_words == OpCompositeExtract) {
    composite_id_index = 4;
  }
  pvVar6 = Instruction::words((Instruction *)member_type_local);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
  pIVar1 = inst_local;
  num_indices = (uint32_t)sVar7;
  kCompositeExtractInsertMaxNumIndices = composite_id_index - 1;
  local_3c = num_indices - composite_id_index;
  local_40 = 0xff;
  if (local_3c == 0) {
    ValidationState_t::diag
              (&local_218,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)member_type_local);
    pDVar8 = DiagnosticStream::operator<<
                       (&local_218,(char (*) [34])"Expected at least one index to Op");
    OVar3 = Instruction::opcode((Instruction *)member_type_local);
    local_220 = spvOpcodeString(OVar3);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_220);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [13])", zero found");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    DiagnosticStream::~DiagnosticStream(&local_218);
  }
  else if (local_3c < 0x100) {
    uVar4 = Instruction::word((Instruction *)member_type_local,
                              (ulong)kCompositeExtractInsertMaxNumIndices);
    uVar4 = ValidationState_t::GetTypeId((ValidationState_t *)pIVar1,uVar4);
    *_word_index = uVar4;
    if (*_word_index == 0) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_5d8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,(Instruction *)member_type_local);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_5d8,
                          (char (*) [53])"Expected Composite to be an object of composite type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5d8);
    }
    else {
      for (; composite_id_index < num_indices; composite_id_index = composite_id_index + 1) {
        type_inst._4_4_ =
             Instruction::word((Instruction *)member_type_local,(ulong)composite_id_index);
        pIStack_5e8 = ValidationState_t::FindDef((ValidationState_t *)inst_local,*_word_index);
        if (pIStack_5e8 == (Instruction *)0x0) {
          __assert_fail("type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                        ,0x42,
                        "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                       );
        }
        OVar3 = Instruction::opcode(pIStack_5e8);
        pIVar1 = inst_local;
        if (OVar3 == OpTypeVector) {
          uVar4 = Instruction::word(pIStack_5e8,2);
          *_word_index = uVar4;
          local_5ec = Instruction::word(pIStack_5e8,3);
          if (local_5ec <= type_inst._4_4_) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_7c8,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)member_type_local);
            pDVar8 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_7c8,
                                (char (*) [48])"Vector access is out of bounds, vector size is ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_5ec);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])0x634e89);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(uint *)((long)&type_inst + 4));
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7c8);
            return __local._4_4_;
          }
        }
        else if (OVar3 == OpTypeMatrix) {
          uVar4 = Instruction::word(pIStack_5e8,2);
          *_word_index = uVar4;
          local_7cc = Instruction::word(pIStack_5e8,3);
          if (local_7cc <= type_inst._4_4_) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&array_size,(ValidationState_t *)inst_local,
                       SPV_ERROR_INVALID_DATA,(Instruction *)member_type_local);
            pDVar8 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&array_size,
                                (char (*) [44])"Matrix access is out of bounds, matrix has ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_7cc);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [31])" columns, but access index is ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(uint *)((long)&type_inst + 4));
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&array_size);
            return __local._4_4_;
          }
        }
        else if (OVar3 == OpTypeArray) {
          size = (Instruction *)0x0;
          uVar4 = Instruction::word(pIStack_5e8,3);
          local_9b8 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
          uVar4 = Instruction::word(pIStack_5e8,2);
          *_word_index = uVar4;
          OVar3 = Instruction::opcode(local_9b8);
          iVar5 = spvOpcodeIsSpecConstant(OVar3);
          pIVar1 = inst_local;
          if (iVar5 == 0) {
            uVar4 = Instruction::word(pIStack_5e8,3);
            bVar2 = ValidationState_t::EvalConstantValUint64
                              ((ValidationState_t *)pIVar1,uVar4,(uint64_t *)&size);
            if (!bVar2) {
              __assert_fail("0 && \"Array type definition is corrupt\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                            ,0x62,
                            "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                           );
            }
            if (size <= (Instruction *)(ulong)type_inst._4_4_) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&num_struct_members,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_DATA,(Instruction *)member_type_local);
              pDVar8 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&num_struct_members,
                                  (char (*) [46])"Array access is out of bounds, array size is ");
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(unsigned_long *)&size);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])0x634e89);
              pDVar8 = DiagnosticStream::operator<<(pDVar8,(uint *)((long)&type_inst + 4));
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&num_struct_members);
              return __local._4_4_;
            }
          }
        }
        else if (OVar3 == OpTypeRuntimeArray) {
          uVar4 = Instruction::word(pIStack_5e8,2);
          *_word_index = uVar4;
        }
        else if (OVar3 == OpTypeStruct) {
          pvVar6 = Instruction::words(pIStack_5e8);
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
          local_b98 = sVar7 - 2;
          if (local_b98 <= type_inst._4_4_) {
            ValidationState_t::diag
                      (&local_d70,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)member_type_local);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_d70,
                                (char (*) [44])"Index is out of bounds, can not find index ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(uint *)((long)&type_inst + 4));
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [25])" in the structure <id> \'")
            ;
            local_d74 = Instruction::id(pIStack_5e8);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_d74);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])"\'. This structure has ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_b98);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [34])" members. Largest valid index is ");
            local_d80 = local_b98 - 1;
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_d80);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x62c2d7);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_d70);
            return __local._4_4_;
          }
          uVar4 = Instruction::word(pIStack_5e8,(ulong)(type_inst._4_4_ + 2));
          *_word_index = uVar4;
        }
        else {
          if ((OVar3 != OpTypeCooperativeMatrixKHR) && (OVar3 != OpTypeCooperativeMatrixNV)) {
            ValidationState_t::diag
                      (&local_f58,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       (Instruction *)member_type_local);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_f58,
                                (char (*) [71])
                                "Reached non-composite type while indexes still remain to be traversed."
                               );
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_f58);
            return __local._4_4_;
          }
          uVar4 = Instruction::word(pIStack_5e8,2);
          *_word_index = uVar4;
        }
      }
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    ValidationState_t::diag
              (&local_3f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)member_type_local);
    pDVar8 = DiagnosticStream::operator<<(&local_3f8,(char (*) [28])"The number of indexes in Op");
    local_400 = spvOpcodeString(num_words);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_400);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [17])" may not exceed ");
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_40);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [9])0x642562);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_3c);
    pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [10])" indexes.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    DiagnosticStream::~DiagnosticStream(&local_3f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t GetExtractInsertValueType(ValidationState_t& _,
                                       const Instruction* inst,
                                       uint32_t* member_type) {
  const spv::Op opcode = inst->opcode();
  assert(opcode == spv::Op::OpCompositeExtract ||
         opcode == spv::Op::OpCompositeInsert);
  uint32_t word_index = opcode == spv::Op::OpCompositeExtract ? 4 : 5;
  const uint32_t num_words = static_cast<uint32_t>(inst->words().size());
  const uint32_t composite_id_index = word_index - 1;
  const uint32_t num_indices = num_words - word_index;
  const uint32_t kCompositeExtractInsertMaxNumIndices = 255;

  if (num_indices == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected at least one index to Op"
           << spvOpcodeString(inst->opcode()) << ", zero found";

  } else if (num_indices > kCompositeExtractInsertMaxNumIndices) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The number of indexes in Op" << spvOpcodeString(opcode)
           << " may not exceed " << kCompositeExtractInsertMaxNumIndices
           << ". Found " << num_indices << " indexes.";
  }

  *member_type = _.GetTypeId(inst->word(composite_id_index));
  if (*member_type == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Composite to be an object of composite type";
  }

  for (; word_index < num_words; ++word_index) {
    const uint32_t component_index = inst->word(word_index);
    const Instruction* const type_inst = _.FindDef(*member_type);
    assert(type_inst);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeVector: {
        *member_type = type_inst->word(2);
        const uint32_t vector_size = type_inst->word(3);
        if (component_index >= vector_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Vector access is out of bounds, vector size is "
                 << vector_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeMatrix: {
        *member_type = type_inst->word(2);
        const uint32_t num_cols = type_inst->word(3);
        if (component_index >= num_cols) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Matrix access is out of bounds, matrix has " << num_cols
                 << " columns, but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeArray: {
        uint64_t array_size = 0;
        auto size = _.FindDef(type_inst->word(3));
        *member_type = type_inst->word(2);
        if (spvOpcodeIsSpecConstant(size->opcode())) {
          // Cannot verify against the size of this array.
          break;
        }

        if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
          assert(0 && "Array type definition is corrupt");
        }
        if (component_index >= array_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Array access is out of bounds, array size is "
                 << array_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeRuntimeArray: {
        *member_type = type_inst->word(2);
        // Array size is unknown.
        break;
      }
      case spv::Op::OpTypeStruct: {
        const size_t num_struct_members = type_inst->words().size() - 2;
        if (component_index >= num_struct_members) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Index is out of bounds, can not find index "
                 << component_index << " in the structure <id> '"
                 << type_inst->id() << "'. This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        *member_type = type_inst->word(component_index + 2);
        break;
      }
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeMatrixNV: {
        *member_type = type_inst->word(2);
        break;
      }
      default:
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Reached non-composite type while indexes still remain to "
                  "be traversed.";
    }
  }

  return SPV_SUCCESS;
}